

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int a;
  int b;
  int iVar1;
  uint uVar2;
  float *pfVar3;
  long lVar4;
  uchar *__ptr;
  long lVar5;
  undefined8 *puVar6;
  char *pcVar7;
  ulong uVar8;
  uchar *puVar9;
  stbi__result_info *in_R9;
  uint uVar10;
  ulong uVar11;
  float *pfVar12;
  ulong uVar13;
  double dVar14;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      puVar6 = (undefined8 *)__tls_get_addr(&PTR_001f3f18);
      pcVar7 = "Image not of any known type, or corrupt";
    }
    else {
      a = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar3 = (float *)stbi__malloc_mad4(a,b,req_comp,4,iVar1);
      if (pfVar3 != (float *)0x0) {
        uVar2 = req_comp - (uint)((req_comp & 1U) == 0);
        uVar10 = b * a;
        if (0 < (int)uVar10) {
          lVar4 = (long)req_comp;
          uVar11 = (ulong)uVar10;
          uVar8 = 0;
          puVar9 = __ptr;
          pfVar12 = pfVar3;
          do {
            if (0 < (int)uVar2) {
              uVar13 = 0;
              do {
                dVar14 = pow((double)((float)puVar9[uVar13] / 255.0),(double)stbi__l2h_gamma);
                pfVar12[uVar13] = (float)((double)stbi__l2h_scale * dVar14);
                uVar13 = uVar13 + 1;
              } while (uVar2 != uVar13);
            }
            uVar8 = uVar8 + 1;
            pfVar12 = pfVar12 + lVar4;
            puVar9 = puVar9 + lVar4;
          } while (uVar8 != uVar11);
          if ((req_comp & 1U) == 0) {
            lVar5 = (long)(int)uVar2;
            do {
              pfVar3[lVar5] = (float)__ptr[lVar5] / 255.0;
              lVar5 = lVar5 + lVar4;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
          }
        }
        free(__ptr);
        return pfVar3;
      }
      free(__ptr);
      puVar6 = (undefined8 *)__tls_get_addr(&PTR_001f3f18);
      pcVar7 = "Out of memory";
    }
    *puVar6 = pcVar7;
  }
  else {
    pfVar3 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if (pfVar3 != (float *)0x0) {
      lVar4 = __tls_get_addr(&PTR_001f3f18);
      iVar1 = stbi__vertically_flip_on_load_global;
      if (*(int *)(lVar4 + 0xc) != 0) {
        iVar1 = *(int *)(lVar4 + 8);
      }
      if (iVar1 == 0) {
        return pfVar3;
      }
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(pfVar3,*x,*y,req_comp << 2);
      return pfVar3;
    }
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}